

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2a17f::TestTestRunnerFixtureSlowTestHasCorrectFailureInformation::
~TestTestRunnerFixtureSlowTestHasCorrectFailureInformation
          (TestTestRunnerFixtureSlowTestHasCorrectFailureInformation *this)

{
  TestTestRunnerFixtureSlowTestHasCorrectFailureInformation *this_local;
  
  ~TestTestRunnerFixtureSlowTestHasCorrectFailureInformation(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, SlowTestHasCorrectFailureInformation)
{
    SlowTest test;
    list.Add(&test);

	runner.RunTestsIf(list, NULL, True(), 3);

	using namespace std;

    CHECK_EQUAL(test.m_details.testName, reporter.lastFailedTest);
    CHECK(strstr(test.m_details.filename, reporter.lastFailedFile));
    CHECK_EQUAL(test.m_details.lineNumber, reporter.lastFailedLine);

	CHECK(strstr(reporter.lastFailedMessage, "Global time constraint failed"));
    CHECK(strstr(reporter.lastFailedMessage, "3ms"));
}